

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-proxy.c
# Opt level: O0

char * platform_setup_local_proxy(Socket *socket,char *cmd)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  char *pcVar4;
  int local_38;
  int pid;
  int cmd_err_pipe [2];
  int from_cmd_pipe [2];
  int to_cmd_pipe [2];
  char *cmd_local;
  Socket *socket_local;
  
  iVar1 = pipe(from_cmd_pipe);
  if (((iVar1 < 0) || (iVar1 = pipe(cmd_err_pipe), iVar1 < 0)) ||
     (iVar1 = pipe(&local_38), iVar1 < 0)) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    pcVar4 = dupprintf("pipe: %s",pcVar4);
    return pcVar4;
  }
  cloexec(from_cmd_pipe[1]);
  cloexec(cmd_err_pipe[0]);
  cloexec(local_38);
  _Var2 = fork();
  if (_Var2 == 0) {
    close(0);
    close(1);
    dup2(from_cmd_pipe[0],0);
    dup2(cmd_err_pipe[1],1);
    close(from_cmd_pipe[0]);
    close(cmd_err_pipe[1]);
    dup2(pid,2);
    noncloexec(0);
    noncloexec(1);
    execl("/bin/sh","sh","-c",cmd,0);
    _exit(0xff);
  }
  if (_Var2 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    pcVar4 = dupprintf("fork: %s",pcVar4);
    return pcVar4;
  }
  close(from_cmd_pipe[0]);
  close(cmd_err_pipe[1]);
  close(pid);
  setup_fd_socket(socket,cmd_err_pipe[0],from_cmd_pipe[1],local_38);
  return (char *)0x0;
}

Assistant:

char *platform_setup_local_proxy(Socket *socket, const char *cmd)
{
    /*
     * Create the pipes to the proxy command, and spawn the proxy
     * command process.
     */
    int to_cmd_pipe[2], from_cmd_pipe[2], cmd_err_pipe[2];
    if (pipe(to_cmd_pipe) < 0 ||
        pipe(from_cmd_pipe) < 0 ||
        pipe(cmd_err_pipe) < 0) {
        return dupprintf("pipe: %s", strerror(errno));
    }
    cloexec(to_cmd_pipe[1]);
    cloexec(from_cmd_pipe[0]);
    cloexec(cmd_err_pipe[0]);

    int pid = fork();
    if (pid == 0) {
        close(0);
        close(1);
        dup2(to_cmd_pipe[0], 0);
        dup2(from_cmd_pipe[1], 1);
        close(to_cmd_pipe[0]);
        close(from_cmd_pipe[1]);
        dup2(cmd_err_pipe[1], 2);
        noncloexec(0);
        noncloexec(1);
        execl("/bin/sh", "sh", "-c", cmd, (void *)NULL);
        _exit(255);
    }

    if (pid < 0) {
        return dupprintf("fork: %s", strerror(errno));
    }

    close(to_cmd_pipe[0]);
    close(from_cmd_pipe[1]);
    close(cmd_err_pipe[1]);

    setup_fd_socket(socket, from_cmd_pipe[0], to_cmd_pipe[1], cmd_err_pipe[0]);

    return NULL;
}